

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall
CppGenerator::generateCode(CppGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t **ppsVar4;
  size_t *psVar5;
  size_t *psVar6;
  TDNode *pTVar7;
  View *pVVar8;
  long *plVar9;
  pointer pbVar10;
  size_t var;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  ushort uVar15;
  byte bVar35;
  byte bVar41;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  char cVar36;
  byte bVar37;
  char cVar38;
  byte bVar39;
  char cVar40;
  char cVar42;
  byte bVar43;
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  var_bitset nodeBag;
  string __str;
  long *local_78;
  ulong uStack_70;
  long local_68;
  long lStack_60;
  char *local_50;
  uint local_48;
  char local_40 [16];
  undefined4 uVar16;
  undefined6 uVar17;
  undefined8 uVar18;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  
  this->_hasApplicationHandler = hasApplicationHandler;
  this->_hasDynamicFunctions = hasDynamicFunctions;
  sVar2 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  sVar3 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  ppsVar4 = (size_t **)operator_new__(-(ulong)(sVar2 + sVar3 >> 0x3d != 0) | (sVar2 + sVar3) * 8);
  this->sortOrders = ppsVar4;
  sVar2 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar13 = sVar2 << 5;
  psVar5 = (size_t *)operator_new__(-(ulong)(sVar2 >> 0x3b != 0) | uVar13 | 8);
  *psVar5 = sVar2;
  if (sVar2 != 0) {
    psVar6 = psVar5 + 3;
    do {
      psVar6[-2] = (size_t)psVar6;
      psVar6[-1] = 0;
      *(undefined1 *)psVar6 = 0;
      psVar6 = psVar6 + 4;
      uVar13 = uVar13 - 0x20;
    } while (uVar13 != 0);
  }
  this->viewName = (string *)(psVar5 + 1);
  sVar2 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar13 = 0xffffffffffffffff;
  if (sVar2 < 0x2000000000000000) {
    uVar13 = sVar2 * 8;
  }
  psVar5 = (size_t *)operator_new__(uVar13);
  this->viewLevelRegister = psVar5;
  sVar2 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      pTVar7 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          sVar2);
      auVar30 = *(undefined1 (*) [16])(pTVar7->_bag).super__Base_bitset<2UL>._M_w;
      auVar44._0_2_ = auVar30._0_2_ >> 1;
      auVar44._2_2_ = auVar30._2_2_ >> 1;
      auVar44._4_2_ = auVar30._4_2_ >> 1;
      auVar44._6_2_ = auVar30._6_2_ >> 1;
      auVar44._8_2_ = auVar30._8_2_ >> 1;
      auVar44._10_2_ = auVar30._10_2_ >> 1;
      auVar44._12_2_ = auVar30._12_2_ >> 1;
      auVar44._14_2_ = auVar30._14_2_ >> 1;
      auVar44 = auVar44 & _DAT_002b0050;
      uVar15 = CONCAT11(auVar30[1] - auVar44[1],auVar30[0] - auVar44[0]);
      uVar16 = CONCAT13(auVar30[3] - auVar44[3],CONCAT12(auVar30[2] - auVar44[2],uVar15));
      uVar17 = CONCAT15(auVar30[5] - auVar44[5],CONCAT14(auVar30[4] - auVar44[4],uVar16));
      uVar18 = CONCAT17(auVar30[7] - auVar44[7],CONCAT16(auVar30[6] - auVar44[6],uVar17));
      auVar21._0_10_ = CONCAT19(auVar30[9] - auVar44[9],CONCAT18(auVar30[8] - auVar44[8],uVar18));
      auVar21[10] = auVar30[10] - auVar44[10];
      auVar21[0xb] = auVar30[0xb] - auVar44[0xb];
      auVar25[0xc] = auVar30[0xc] - auVar44[0xc];
      auVar25._0_12_ = auVar21;
      auVar25[0xd] = auVar30[0xd] - auVar44[0xd];
      auVar29[0xe] = auVar30[0xe] - auVar44[0xe];
      auVar29._0_14_ = auVar25;
      auVar29[0xf] = auVar30[0xf] - auVar44[0xf];
      auVar44 = auVar29 & _DAT_002b0060;
      auVar30._0_2_ = uVar15 >> 2;
      auVar30._2_2_ = (ushort)((uint)uVar16 >> 0x12);
      auVar30._4_2_ = (ushort)((uint6)uVar17 >> 0x22);
      auVar30._6_2_ = (ushort)((ulong)uVar18 >> 0x32);
      auVar30._8_2_ = (ushort)((unkuint10)auVar21._0_10_ >> 0x42);
      auVar30._10_2_ = auVar21._10_2_ >> 2;
      auVar30._12_2_ = auVar25._12_2_ >> 2;
      auVar30._14_2_ = auVar29._14_2_ >> 2;
      auVar30 = auVar30 & _DAT_002b0060;
      cVar14 = auVar30[0] + auVar44[0];
      bVar35 = auVar30[1] + auVar44[1];
      uVar15 = CONCAT11(bVar35,cVar14);
      cVar36 = auVar30[2] + auVar44[2];
      bVar37 = auVar30[3] + auVar44[3];
      uVar16 = CONCAT13(bVar37,CONCAT12(cVar36,uVar15));
      cVar38 = auVar30[4] + auVar44[4];
      bVar39 = auVar30[5] + auVar44[5];
      uVar17 = CONCAT15(bVar39,CONCAT14(cVar38,uVar16));
      cVar40 = auVar30[6] + auVar44[6];
      bVar41 = auVar30[7] + auVar44[7];
      uVar18 = CONCAT17(bVar41,CONCAT16(cVar40,uVar17));
      cVar42 = auVar30[8] + auVar44[8];
      bVar43 = auVar30[9] + auVar44[9];
      auVar22._0_10_ = CONCAT19(bVar43,CONCAT18(cVar42,uVar18));
      auVar22[10] = auVar30[10] + auVar44[10];
      auVar22[0xb] = auVar30[0xb] + auVar44[0xb];
      auVar26[0xc] = auVar30[0xc] + auVar44[0xc];
      auVar26._0_12_ = auVar22;
      auVar26[0xd] = auVar30[0xd] + auVar44[0xd];
      auVar31[0xe] = auVar30[0xe] + auVar44[0xe];
      auVar31._0_14_ = auVar26;
      auVar31[0xf] = auVar30[0xf] + auVar44[0xf];
      auVar45[0] = (char)(uVar15 >> 4) + cVar14;
      auVar45[1] = (bVar35 >> 4) + bVar35;
      auVar45[2] = (char)(ushort)((uint)uVar16 >> 0x14) + cVar36;
      auVar45[3] = (bVar37 >> 4) + bVar37;
      auVar45[4] = (char)(ushort)((uint6)uVar17 >> 0x24) + cVar38;
      auVar45[5] = (bVar39 >> 4) + bVar39;
      auVar45[6] = (char)(ushort)((ulong)uVar18 >> 0x34) + cVar40;
      auVar45[7] = (bVar41 >> 4) + bVar41;
      auVar45[8] = (char)(ushort)((unkuint10)auVar22._0_10_ >> 0x44) + cVar42;
      auVar45[9] = (bVar43 >> 4) + bVar43;
      auVar45[10] = (char)(auVar22._10_2_ >> 4) + auVar22[10];
      auVar45[0xb] = (auVar22[0xb] >> 4) + auVar22[0xb];
      auVar45[0xc] = (char)(auVar26._12_2_ >> 4) + auVar26[0xc];
      auVar45[0xd] = (auVar26[0xd] >> 4) + auVar26[0xd];
      auVar45[0xe] = (char)(auVar31._14_2_ >> 4) + auVar31[0xe];
      auVar45[0xf] = (auVar31[0xf] >> 4) + auVar31[0xf];
      auVar30 = psadbw(auVar45 & _DAT_002b0070,_DAT_002a4010);
      uVar19 = auVar30._8_8_ + auVar30._0_8_;
      uVar13 = 0xffffffffffffffff;
      if (uVar19 < 0x2000000000000000) {
        uVar13 = (ulong)(uint)((int)uVar19 << 3);
      }
      psVar5 = (size_t *)operator_new__(uVar13);
      memset(psVar5,0,uVar13);
      this->sortOrders[sVar2] = psVar5;
      sVar2 = sVar2 + 1;
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (sVar2 < sVar3);
  }
  sVar2 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar2 != 0) {
    uVar13 = 0;
    do {
      pVVar8 = QueryCompiler::getView
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,uVar13);
      auVar30 = *(undefined1 (*) [16])(pVVar8->_fVars).super__Base_bitset<2UL>._M_w;
      auVar46._0_2_ = auVar30._0_2_ >> 1;
      auVar46._2_2_ = auVar30._2_2_ >> 1;
      auVar46._4_2_ = auVar30._4_2_ >> 1;
      auVar46._6_2_ = auVar30._6_2_ >> 1;
      auVar46._8_2_ = auVar30._8_2_ >> 1;
      auVar46._10_2_ = auVar30._10_2_ >> 1;
      auVar46._12_2_ = auVar30._12_2_ >> 1;
      auVar46._14_2_ = auVar30._14_2_ >> 1;
      auVar46 = auVar46 & _DAT_002b0050;
      uVar15 = CONCAT11(auVar30[1] - auVar46[1],auVar30[0] - auVar46[0]);
      uVar16 = CONCAT13(auVar30[3] - auVar46[3],CONCAT12(auVar30[2] - auVar46[2],uVar15));
      uVar17 = CONCAT15(auVar30[5] - auVar46[5],CONCAT14(auVar30[4] - auVar46[4],uVar16));
      uVar18 = CONCAT17(auVar30[7] - auVar46[7],CONCAT16(auVar30[6] - auVar46[6],uVar17));
      auVar23._0_10_ = CONCAT19(auVar30[9] - auVar46[9],CONCAT18(auVar30[8] - auVar46[8],uVar18));
      auVar23[10] = auVar30[10] - auVar46[10];
      auVar23[0xb] = auVar30[0xb] - auVar46[0xb];
      auVar27[0xc] = auVar30[0xc] - auVar46[0xc];
      auVar27._0_12_ = auVar23;
      auVar27[0xd] = auVar30[0xd] - auVar46[0xd];
      auVar32[0xe] = auVar30[0xe] - auVar46[0xe];
      auVar32._0_14_ = auVar27;
      auVar32[0xf] = auVar30[0xf] - auVar46[0xf];
      auVar30 = auVar32 & _DAT_002b0060;
      auVar33._0_2_ = uVar15 >> 2;
      auVar33._2_2_ = (ushort)((uint)uVar16 >> 0x12);
      auVar33._4_2_ = (ushort)((uint6)uVar17 >> 0x22);
      auVar33._6_2_ = (ushort)((ulong)uVar18 >> 0x32);
      auVar33._8_2_ = (ushort)((unkuint10)auVar23._0_10_ >> 0x42);
      auVar33._10_2_ = auVar23._10_2_ >> 2;
      auVar33._12_2_ = auVar27._12_2_ >> 2;
      auVar33._14_2_ = auVar32._14_2_ >> 2;
      auVar33 = auVar33 & _DAT_002b0060;
      cVar14 = auVar33[0] + auVar30[0];
      bVar35 = auVar33[1] + auVar30[1];
      uVar15 = CONCAT11(bVar35,cVar14);
      cVar36 = auVar33[2] + auVar30[2];
      bVar37 = auVar33[3] + auVar30[3];
      uVar16 = CONCAT13(bVar37,CONCAT12(cVar36,uVar15));
      cVar38 = auVar33[4] + auVar30[4];
      bVar39 = auVar33[5] + auVar30[5];
      uVar17 = CONCAT15(bVar39,CONCAT14(cVar38,uVar16));
      cVar40 = auVar33[6] + auVar30[6];
      bVar41 = auVar33[7] + auVar30[7];
      uVar18 = CONCAT17(bVar41,CONCAT16(cVar40,uVar17));
      cVar42 = auVar33[8] + auVar30[8];
      bVar43 = auVar33[9] + auVar30[9];
      auVar24._0_10_ = CONCAT19(bVar43,CONCAT18(cVar42,uVar18));
      auVar24[10] = auVar33[10] + auVar30[10];
      auVar24[0xb] = auVar33[0xb] + auVar30[0xb];
      auVar28[0xc] = auVar33[0xc] + auVar30[0xc];
      auVar28._0_12_ = auVar24;
      auVar28[0xd] = auVar33[0xd] + auVar30[0xd];
      auVar34[0xe] = auVar33[0xe] + auVar30[0xe];
      auVar34._0_14_ = auVar28;
      auVar34[0xf] = auVar33[0xf] + auVar30[0xf];
      auVar47[0] = (char)(uVar15 >> 4) + cVar14;
      auVar47[1] = (bVar35 >> 4) + bVar35;
      auVar47[2] = (char)(ushort)((uint)uVar16 >> 0x14) + cVar36;
      auVar47[3] = (bVar37 >> 4) + bVar37;
      auVar47[4] = (char)(ushort)((uint6)uVar17 >> 0x24) + cVar38;
      auVar47[5] = (bVar39 >> 4) + bVar39;
      auVar47[6] = (char)(ushort)((ulong)uVar18 >> 0x34) + cVar40;
      auVar47[7] = (bVar41 >> 4) + bVar41;
      auVar47[8] = (char)(ushort)((unkuint10)auVar24._0_10_ >> 0x44) + cVar42;
      auVar47[9] = (bVar43 >> 4) + bVar43;
      auVar47[10] = (char)(auVar24._10_2_ >> 4) + auVar24[10];
      auVar47[0xb] = (auVar24[0xb] >> 4) + auVar24[0xb];
      auVar47[0xc] = (char)(auVar28._12_2_ >> 4) + auVar28[0xc];
      auVar47[0xd] = (auVar28[0xd] >> 4) + auVar28[0xd];
      auVar47[0xe] = (char)(auVar34._14_2_ >> 4) + auVar34[0xe];
      auVar47[0xf] = (auVar34[0xf] >> 4) + auVar34[0xf];
      auVar30 = psadbw(auVar47 & _DAT_002b0070,_DAT_002a4010);
      uVar20 = auVar30._8_8_ + auVar30._0_8_;
      uVar19 = (ulong)(uint)((int)uVar20 * 8);
      if (0x1fffffffffffffff < uVar20) {
        uVar19 = 0xffffffffffffffff;
      }
      psVar5 = (size_t *)operator_new__(uVar19);
      memset(psVar5,0,uVar19);
      ppsVar4 = this->sortOrders;
      sVar2 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ppsVar4[uVar13 + sVar2] = psVar5;
      cVar14 = '\x01';
      if (9 < uVar13) {
        uVar19 = uVar13;
        cVar36 = '\x04';
        do {
          cVar14 = cVar36;
          if (uVar19 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_001f1f59;
          }
          if (uVar19 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_001f1f59;
          }
          if (uVar19 < 10000) goto LAB_001f1f59;
          bVar1 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar36 = cVar14 + '\x04';
        } while (bVar1);
        cVar14 = cVar14 + '\x01';
      }
LAB_001f1f59:
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar13);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2a8219);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_68 = *plVar11;
        lStack_60 = plVar9[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar11;
        local_78 = (long *)*plVar9;
      }
      uStack_70 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)(this->viewName + uVar13),(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar13 = uVar13 + 1;
      sVar2 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    } while (uVar13 < sVar2);
  }
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&this->variableDependency,100);
  sVar2 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      pTVar7 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          sVar2);
      local_78 = (long *)(pTVar7->_bag).super__Base_bitset<2UL>._M_w[0];
      uStack_70 = (pTVar7->_bag).super__Base_bitset<2UL>._M_w[1];
      pbVar10 = (this->variableDependency).
                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (((ulong)(&local_78)[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) {
          uVar19 = (pbVar10->super__Base_bitset<2UL>)._M_w[1];
          (pbVar10->super__Base_bitset<2UL>)._M_w[0] =
               (pbVar10->super__Base_bitset<2UL>)._M_w[0] | (ulong)local_78;
          (pbVar10->super__Base_bitset<2UL>)._M_w[1] = uVar19 | uStack_70;
        }
        uVar13 = uVar13 + 1;
        pbVar10 = pbVar10 + 1;
      } while (uVar13 != 100);
      sVar2 = sVar2 + 1;
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (sVar2 < sVar3);
  }
  ppsVar4 = this->sortOrders;
  pTVar7 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _root;
  uVar13 = 0;
  lVar12 = 0;
  do {
    if (((pTVar7->_bag).super__Base_bitset<2UL>._M_w[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) {
      ppsVar4[pTVar7->_id][lVar12] = uVar13;
      lVar12 = lVar12 + 1;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  pTVar7 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _root;
  createRelationSortingOrder(this,pTVar7,&pTVar7->_id);
  createGroupVariableOrder(this);
  computeParallelizeGroup(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffe) == 2);
  genDataHandler(this);
  if ((this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar2 = 0;
    do {
      genComputeGroupFiles(this,sVar2);
      sVar2 = sVar2 + 1;
    } while (sVar2 < (ulong)(((long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  genMainFunction(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffd) == 1);
  genMakeFile(this);
  return;
}

Assistant:

void CppGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Start generate C++ code. \n");

    _hasApplicationHandler = hasApplicationHandler;
    _hasDynamicFunctions = hasDynamicFunctions;
    
    sortOrders = new size_t*[_td->numberOfRelations() + _qc->numberOfViews()];
    viewName = new std::string[_qc->numberOfViews()];
    viewLevelRegister  = new size_t[_qc->numberOfViews()];
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        sortOrders[rel] = new size_t[_td->getRelation(rel)->_bag.count()]();
    
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {   
        sortOrders[view + _td->numberOfRelations()] =
            new size_t[_qc->getView(view)->_fVars.count()]();
        viewName[view] = "V"+std::to_string(view);
    }
    
    variableDependency.resize(NUM_OF_VARIABLES);
    
    // Find all the dependencies amongst the variables
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        var_bitset nodeBag = _td->getRelation(rel)->_bag;

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (nodeBag[var])
                variableDependency[var] |= nodeBag;
        }
    }
    
    // FIRST WE CREATE THE VARIABLE ORDER FOR EACH RELATION
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_td->_root->_bag[var])
        {
            sortOrders[_td->_root->_id][orderIdx] = var;
            ++orderIdx;
        }
    }
    
    createRelationSortingOrder(_td->_root, _td->_root->_id);
    
    createGroupVariableOrder();

    bool domainParallelism = PARALLEL_TYPE == DOMAIN_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    computeParallelizeGroup(domainParallelism);
    
    genDataHandler();
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
        genComputeGroupFiles(group);
    
    bool taskParallelism = PARALLEL_TYPE == TASK_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    genMainFunction(taskParallelism);
    
    genMakeFile();    
}